

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O1

UStringTrieResult __thiscall icu_63::UCharsTrie::next(UCharsTrie *this,int32_t uchar)

{
  char16_t cVar1;
  UChar UVar2;
  UChar UVar3;
  int iVar4;
  char16_t *pcVar5;
  UStringTrieResult UVar6;
  UStringTrieResult UVar7;
  UChar *pos;
  
  pcVar5 = this->pos_;
  UVar6 = USTRINGTRIE_NO_MATCH;
  if (pcVar5 != (char16_t *)0x0) {
    iVar4 = this->remainingMatchLength_;
    if (iVar4 < 0) {
      cVar1 = *pcVar5;
      pos = pcVar5 + 1;
      UVar6 = (uint)(ushort)cVar1;
      if (0x2f < (ushort)cVar1) {
        UVar6 = (ushort)cVar1 & 0x3f;
        UVar7 = (uint)(ushort)cVar1;
        do {
          if (UVar7 < 0x40) {
            UVar2 = *pos;
            if ((uint)(ushort)UVar2 == uchar) {
              this->remainingMatchLength_ = UVar7 - 0x31;
              this->pos_ = pos + 1;
              UVar6 = USTRINGTRIE_NO_VALUE;
              if ((UVar7 == 0x30) && (UVar3 = pos[1], 0x3f < (ushort)UVar3)) {
                UVar6 = (ushort)UVar3 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
              }
            }
            if ((uint)(ushort)UVar2 == uchar) {
              return UVar6;
            }
LAB_002af460:
            this->pos_ = (char16_t *)0x0;
            return USTRINGTRIE_NO_MATCH;
          }
          if (0x7fff < UVar7) goto LAB_002af460;
          if (0x403f < UVar7) {
            if (UVar7 < 0x7fc0) {
              pos = pos + 1;
            }
            else {
              pos = pos + 2;
            }
          }
          UVar7 = UVar6;
        } while (0x2f < UVar6);
      }
      UVar6 = branchNext(this,pos,UVar6,uchar);
      return UVar6;
    }
    if ((uint)(ushort)*pcVar5 == uchar) {
      UVar6 = USTRINGTRIE_NO_VALUE;
      this->remainingMatchLength_ = iVar4 + -1;
      this->pos_ = pcVar5 + 1;
      if ((iVar4 == 0) && (cVar1 = pcVar5[1], 0x3f < (ushort)cVar1)) {
        return (ushort)cVar1 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      }
    }
    else {
      this->pos_ = (char16_t *)0x0;
    }
  }
  return UVar6;
}

Assistant:

UStringTrieResult
UCharsTrie::next(int32_t uchar) {
    const UChar *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    if(length>=0) {
        // Remaining part of a linear-match node.
        if(uchar==*pos++) {
            remainingMatchLength_=--length;
            pos_=pos;
            int32_t node;
            return (length<0 && (node=*pos)>=kMinValueLead) ?
                    valueResult(node) : USTRINGTRIE_NO_VALUE;
        } else {
            stop();
            return USTRINGTRIE_NO_MATCH;
        }
    }
    return nextImpl(pos, uchar);
}